

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::isConversionAllowed(TIntermediate *this,TOperator op,TIntermTyped *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
  if (1 < iVar1 - 0xdU) {
    if (iVar1 == 0) {
      return false;
    }
    if (iVar1 != 0x11) {
      return true;
    }
  }
  if ((op != EOpFunction) &&
     ((this->source != EShSourceHlsl ||
      (iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar1 != 0xe)))) {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    if (op != EOpAssign) {
      return false;
    }
    if (iVar1 != 0xe) {
      return false;
    }
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])(node);
    if ((CONCAT44(extraout_var,iVar1) == 0) ||
       (iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])(node),
       *(int *)(CONCAT44(extraout_var_00,iVar1) + 0xb8) != 0x1d7)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool TIntermediate::isConversionAllowed(TOperator op, TIntermTyped* node) const
{
    //
    // Does the base type even allow the operation?
    //
    switch (node->getBasicType()) {
    case EbtVoid:
        return false;
    case EbtAtomicUint:
    case EbtSampler:
    case EbtAccStruct:
        // opaque types can be passed to functions
        if (op == EOpFunction)
            break;

        // HLSL can assign samplers directly (no constructor)
        if (getSource() == EShSourceHlsl && node->getBasicType() == EbtSampler)
            break;

        // samplers can get assigned via a sampler constructor
        // (well, not yet, but code in the rest of this function is ready for it)
        if (node->getBasicType() == EbtSampler && op == EOpAssign &&
            node->getAsOperator() != nullptr && node->getAsOperator()->getOp() == EOpConstructTextureSampler)
            break;

        // otherwise, opaque types can't even be operated on, let alone converted
        return false;
    default:
        break;
    }

    return true;
}